

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

char * spvc_compiler_get_cleansed_entry_point_name
                 (spvc_compiler compiler,char *name,SpvExecutionModel model)

{
  Compiler *this;
  pointer pcVar1;
  string *psVar2;
  char *pcVar3;
  string cleansed_name;
  allocator local_89;
  string local_88 [2];
  string local_48;
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_48,name,&local_89);
  psVar2 = spirv_cross::Compiler::get_cleansed_entry_point_name(this,&local_48,model);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_88[0]._M_dataplus._M_p = (pointer)&local_88[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + psVar2->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pcVar3 = spvc_context_s::allocate_name(compiler->context,local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != &local_88[0].field_2) {
    operator_delete(local_88[0]._M_dataplus._M_p);
  }
  return pcVar3;
}

Assistant:

const char *spvc_compiler_get_cleansed_entry_point_name(spvc_compiler compiler, const char *name,
                                                        SpvExecutionModel model)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto cleansed_name =
		    compiler->compiler->get_cleansed_entry_point_name(name, static_cast<spv::ExecutionModel>(model));
		return compiler->context->allocate_name(cleansed_name);
	}